

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O0

MaybeStackArray<char,_40> * __thiscall
icu_63::MaybeStackArray<char,_40>::operator=
          (MaybeStackArray<char,_40> *this,MaybeStackArray<char,_40> *src)

{
  MaybeStackArray<char,_40> *src_local;
  MaybeStackArray<char,_40> *this_local;
  
  releaseArray(this);
  this->capacity = src->capacity;
  this->needToRelease = src->needToRelease;
  if (src->ptr == src->stackArray) {
    this->ptr = this->stackArray;
    memcpy(this->stackArray,src->stackArray,(long)src->capacity);
  }
  else {
    this->ptr = src->ptr;
    resetToStackArray(src);
  }
  return this;
}

Assistant:

inline MaybeStackArray <T, stackCapacity>&
MaybeStackArray<T, stackCapacity>::operator=(MaybeStackArray <T, stackCapacity>&& src) U_NOEXCEPT {
    releaseArray();  // in case this instance had its own memory allocated
    capacity = src.capacity;
    needToRelease = src.needToRelease;
    if (src.ptr == src.stackArray) {
        ptr = stackArray;
        uprv_memcpy(stackArray, src.stackArray, sizeof(T) * src.capacity);
    } else {
        ptr = src.ptr;
        src.resetToStackArray();  // take ownership away from src
    }
    return *this;
}